

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram_enc.c
# Opt level: O1

int VP8LGetHistoImageSymbols
              (int xsize,int ysize,VP8LBackwardRefs *refs,int quality,int low_effort,
              int histogram_bits,int cache_bits,VP8LHistogramSet *image_histo,
              VP8LHistogram *tmp_histo,uint32_t *histogram_symbols,WebPPicture *pic,
              int percent_range,int *percent)

{
  ushort uVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  VP8LHistogram *pVVar5;
  VP8LHistogram *b;
  bool bVar6;
  undefined8 uVar7;
  bool bVar8;
  HistogramPair *pHVar9;
  void *__s;
  PixOrCopy *pPVar10;
  char cVar11;
  int iVar12;
  uint32_t uVar13;
  uint32_t uVar14;
  uint uVar15;
  VP8LHistogramSet *pVVar16;
  VP8LHistogram **ppVVar17;
  int64_t iVar18;
  void *pvVar19;
  uint uVar20;
  ulong uVar21;
  ushort uVar22;
  int iVar23;
  long lVar24;
  ulong uVar25;
  VP8LHistogram *pVVar26;
  short sVar27;
  ulong uVar28;
  long lVar29;
  uint32_t *puVar30;
  ulong uVar31;
  ushort *puVar32;
  byte bVar33;
  ulong uVar34;
  long lVar35;
  long lVar36;
  long lVar37;
  long lVar38;
  long lVar39;
  uint64_t nmemb;
  int64_t iVar40;
  ulong uVar41;
  PixOrCopy *v;
  VP8LHistogram *pVVar42;
  long lVar43;
  short sVar44;
  short sVar45;
  int iVar46;
  VP8LHistogram **ppVVar47;
  size_t __nmemb;
  HistogramPair *pair;
  undefined1 auVar48 [16];
  int iVar49;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  int iVar69;
  int iVar72;
  undefined1 auVar70 [16];
  int iVar73;
  undefined1 auVar71 [16];
  undefined1 in_XMM11 [16];
  undefined1 auVar74 [16];
  undefined1 in_XMM12 [16];
  undefined1 auVar75 [16];
  uint16_t *bin_map;
  int num_used_orig;
  uint local_1a4;
  VP8LHistogram **local_1a0;
  uint local_194;
  VP8LHistogram *local_190;
  HistoQueue local_188;
  VP8LHistogram *local_178;
  uint local_16c;
  void *local_168;
  VP8LHistogramSet *local_160;
  VP8LBackwardRefs *local_158;
  VP8LHistogram *local_150;
  uint64_t local_148;
  int local_140;
  undefined4 local_13c;
  VP8LRefsCursor local_138 [11];
  
  bVar33 = (byte)histogram_bits;
  iVar23 = 1 << (bVar33 & 0x1f);
  uVar20 = ((ysize + iVar23) - 1U >> (bVar33 & 0x1f)) * ((xsize + iVar23) - 1U >> (bVar33 & 0x1f));
  if (histogram_bits == 0) {
    uVar20 = 1;
  }
  local_194 = quality;
  local_158 = refs;
  pVVar16 = VP8LAllocateHistogramSet(uVar20,cache_bits);
  local_190 = (VP8LHistogram *)CONCAT44(local_190._4_4_,low_effort);
  local_150 = (VP8LHistogram *)0x40;
  if (low_effort != 0) {
    local_150 = (VP8LHistogram *)0x4;
  }
  local_168 = WebPSafeMalloc((long)(int)(uVar20 * 2),2);
  local_1a4 = uVar20;
  local_178 = (VP8LHistogram *)(ulong)uVar20;
  if (local_168 == (void *)0x0 || pVVar16 == (VP8LHistogramSet *)0x0) {
    WebPEncodingSetError(pic,VP8_ENC_ERROR_OUT_OF_MEMORY);
    pvVar19 = local_168;
    goto LAB_00148d56;
  }
  local_1a0 = pVVar16->histograms;
  VP8LRefsCursorInit(local_138,local_158);
  local_160 = pVVar16;
  VP8LHistogramSetClear(pVVar16);
  if (local_138[0].cur_pos != (PixOrCopy *)0x0) {
    iVar23 = 0;
    iVar46 = 0;
    do {
      pPVar10 = local_138[0].cur_pos;
      VP8LHistogramAddSinglePixOrCopy
                (local_1a0[(int)((iVar23 >> (bVar33 & 0x1f)) +
                                (iVar46 >> (bVar33 & 0x1f)) *
                                ((xsize + (1 << (bVar33 & 0x1f))) - 1U >> (bVar33 & 0x1f)))],
                 local_138[0].cur_pos,(_func_int_int_int *)0x0,0);
      for (iVar23 = (uint)pPVar10->len + iVar23; xsize <= iVar23; iVar23 = iVar23 - xsize) {
        iVar46 = iVar46 + 1;
      }
      local_138[0].cur_pos = local_138[0].cur_pos + 1;
      if (local_138[0].cur_pos == local_138[0].last_pos_) {
        VP8LRefsCursorNextBlock(local_138);
      }
    } while (local_138[0].cur_pos != (PixOrCopy *)0x0);
  }
  local_138[0].cur_pos = (PixOrCopy *)CONCAT44(local_138[0].cur_pos._4_4_,(int)local_178);
  if (0 < local_160->max_size) {
    ppVVar47 = local_160->histograms;
    local_1a0 = image_histo->histograms;
    lVar43 = 0;
    uVar14 = 0;
    do {
      pVVar42 = ppVVar47[lVar43];
      UpdateHistogramCost(pVVar42);
      if ((((pVVar42->is_used_[0] == '\0') && (pVVar42->is_used_[1] == '\0')) &&
          (pVVar42->is_used_[2] == '\0')) &&
         ((pVVar42->is_used_[3] == '\0' && (pVVar42->is_used_[4] == '\0')))) {
        HistogramSetRemoveHistogram(image_histo,(int)lVar43,(int *)&local_1a4);
        pVVar16 = local_160;
        HistogramSetRemoveHistogram(local_160,(int)lVar43,(int *)local_138);
        uVar13 = 0xffffffff;
      }
      else {
        pVVar26 = local_1a0[lVar43];
        iVar23 = pVVar26->palette_code_bits_;
        iVar12 = (4 << ((byte)iVar23 & 0x1f)) + 0x1138;
        iVar46 = (1 << ((byte)iVar23 & 0x1f)) + 0x118;
        if (iVar23 < 1) {
          iVar46 = 0x118;
        }
        puVar30 = pVVar26->literal_;
        if (iVar23 < 1) {
          iVar12 = 0x1138;
        }
        memcpy(pVVar26,pVVar42,(long)iVar12);
        pVVar26->literal_ = puVar30;
        memcpy(puVar30,pVVar42->literal_,(long)iVar46 << 2);
        pVVar16 = local_160;
        uVar13 = uVar14;
        uVar14 = uVar14 + 1;
      }
      histogram_symbols[lVar43] = uVar13;
      lVar43 = lVar43 + 1;
    } while (lVar43 < pVVar16->max_size);
  }
  pvVar19 = local_168;
  ppVVar47 = (VP8LHistogram **)(ulong)local_1a4;
  iVar23 = (int)local_150 * 2;
  bVar33 = (int)local_194 < 100 && iVar23 < (int)local_1a4;
  if ((int)local_194 < 100 && iVar23 < (int)local_1a4) {
    local_158 = (VP8LBackwardRefs *)&working_state_cur_put_buffer_simd;
    if ((int)local_194 < 0x5a) {
      local_158 = (VP8LBackwardRefs *)
                  (ulong)((((uint)((int)local_178 < 0x101) * 8 + 8 >> (0x200 < (int)local_178)) >>
                          (0x400 < (int)local_178)) >> ((int)local_194 < 0x33));
    }
    local_148 = CONCAT71(local_148._1_7_,bVar33);
    ppVVar17 = image_histo->histograms;
    iVar23 = image_histo->size;
    lVar43 = (long)iVar23;
    if (lVar43 < 1) {
      uVar25 = 0;
      uVar28 = 0xffffffffffffffff;
      uVar34 = 0xffffffffffffffff;
      uVar41 = 0;
      uVar21 = 0xffffffffffffffff;
      uVar31 = 0;
    }
    else {
      uVar21 = 0xffffffffffffffff;
      lVar35 = 0;
      uVar31 = 0;
      uVar41 = 0;
      uVar34 = 0xffffffffffffffff;
      uVar25 = 0;
      uVar28 = 0xffffffffffffffff;
      do {
        pVVar42 = ppVVar17[lVar35];
        if (pVVar42 != (VP8LHistogram *)0x0) {
          uVar3 = pVVar42->literal_cost_;
          if (uVar31 <= uVar3) {
            uVar31 = uVar3;
          }
          uVar4 = pVVar42->red_cost_;
          if (uVar3 <= uVar21) {
            uVar21 = uVar3;
          }
          if (uVar41 <= uVar4) {
            uVar41 = uVar4;
          }
          if (uVar4 <= uVar34) {
            uVar34 = uVar4;
          }
          uVar3 = pVVar42->blue_cost_;
          if (uVar25 <= uVar3) {
            uVar25 = uVar3;
          }
          if (uVar3 <= uVar28) {
            uVar28 = uVar3;
          }
        }
        lVar35 = lVar35 + 1;
      } while (lVar43 != lVar35);
    }
    lVar35 = (long)(int)local_178;
    if (0 < iVar23) {
      lVar36 = uVar31 - uVar21;
      auVar51._8_4_ = (int)((ulong)lVar36 >> 0x20);
      auVar51._0_8_ = lVar36;
      auVar51._12_4_ = 0x45300000;
      lVar37 = uVar41 - uVar34;
      auVar56._8_4_ = (int)((ulong)lVar37 >> 0x20);
      auVar56._0_8_ = lVar37;
      auVar56._12_4_ = 0x45300000;
      lVar38 = uVar25 - uVar28;
      auVar74._8_4_ = (int)((ulong)lVar38 >> 0x20);
      auVar74._0_8_ = lVar38;
      auVar74._12_4_ = 0x45300000;
      lVar39 = 0;
      do {
        pVVar42 = ppVVar17[lVar39];
        if (pVVar42 != (VP8LHistogram *)0x0) {
          sVar45 = 0;
          if (uVar31 != uVar21) {
            lVar24 = pVVar42->literal_cost_ - uVar21;
            auVar75._8_4_ = (int)((ulong)lVar24 >> 0x20);
            auVar75._0_8_ = lVar24;
            auVar75._12_4_ = 0x45300000;
            sVar45 = (short)(int)((((auVar75._8_8_ - 1.9342813113834067e+25) +
                                   ((double)CONCAT44(0x43300000,(int)lVar24) - 4503599627370496.0))
                                  * 3.999999) /
                                 ((auVar51._8_8_ - 1.9342813113834067e+25) +
                                 ((double)CONCAT44(0x43300000,(int)lVar36) - 4503599627370496.0)));
          }
          if ((int)local_190 == 0) {
            sVar27 = 0;
            sVar44 = 0;
            if (uVar41 != uVar34) {
              lVar24 = pVVar42->red_cost_ - uVar34;
              auVar59._8_4_ = (int)((ulong)lVar24 >> 0x20);
              auVar59._0_8_ = lVar24;
              auVar59._12_4_ = 0x45300000;
              sVar44 = (short)((int)((((auVar59._8_8_ - 1.9342813113834067e+25) +
                                      ((double)CONCAT44(0x43300000,(int)lVar24) - 4503599627370496.0
                                      )) * 3.999999) /
                                    ((auVar56._8_8_ - 1.9342813113834067e+25) +
                                    ((double)CONCAT44(0x43300000,(int)lVar37) - 4503599627370496.0))
                                    ) << 2);
            }
            if (uVar25 != uVar28) {
              lVar24 = pVVar42->blue_cost_ - uVar28;
              auVar60._8_4_ = (int)((ulong)lVar24 >> 0x20);
              auVar60._0_8_ = lVar24;
              auVar60._12_4_ = 0x45300000;
              sVar27 = (short)(int)((((auVar60._8_8_ - 1.9342813113834067e+25) +
                                     ((double)CONCAT44(0x43300000,(int)lVar24) - 4503599627370496.0)
                                     ) * 3.999999) /
                                   ((auVar74._8_8_ - 1.9342813113834067e+25) +
                                   ((double)CONCAT44(0x43300000,(int)lVar38) - 4503599627370496.0)))
              ;
            }
            sVar45 = sVar44 + sVar45 * 0x10 + sVar27;
          }
          *(short *)((long)local_168 + lVar39 * 2) = sVar45;
        }
        lVar39 = lVar39 + 1;
      } while (lVar43 != lVar39);
    }
    auVar51 = _DAT_001b3ab0;
    local_178 = tmp_histo;
    uVar21 = 0;
    do {
      *(undefined4 *)((long)&local_138[0].cur_pos + uVar21 * 4) = 0xffff;
      uVar21 = uVar21 + 1;
    } while (((ulong)local_150 & 0xffffffff) != uVar21);
    if (0 < (int)local_1a4) {
      lVar43 = (long)ppVVar47 + -1;
      auVar48._8_4_ = (int)lVar43;
      auVar48._0_8_ = lVar43;
      auVar48._12_4_ = (int)((ulong)lVar43 >> 0x20);
      uVar21 = 0;
      auVar48 = auVar48 ^ _DAT_001b3ab0;
      auVar55._8_4_ = 0xffffffff;
      auVar55._0_8_ = 0xffffffffffffffff;
      auVar55._12_4_ = 0xffffffff;
      auVar50 = _DAT_001b65c0;
      auVar52 = _DAT_001b65d0;
      auVar53 = _DAT_001b4f90;
      auVar54 = _DAT_001b2870;
      do {
        auVar56 = auVar54 ^ auVar51;
        iVar46 = auVar48._0_4_;
        iVar69 = -(uint)(iVar46 < auVar56._0_4_);
        iVar12 = auVar48._4_4_;
        auVar57._4_4_ = -(uint)(iVar12 < auVar56._4_4_);
        iVar73 = auVar48._8_4_;
        iVar72 = -(uint)(iVar73 < auVar56._8_4_);
        iVar49 = auVar48._12_4_;
        auVar57._12_4_ = -(uint)(iVar49 < auVar56._12_4_);
        auVar64._4_4_ = iVar69;
        auVar64._0_4_ = iVar69;
        auVar64._8_4_ = iVar72;
        auVar64._12_4_ = iVar72;
        auVar74 = pshuflw(in_XMM11,auVar64,0xe8);
        auVar66._4_4_ = -(uint)(auVar56._4_4_ == iVar12);
        auVar66._12_4_ = -(uint)(auVar56._12_4_ == iVar49);
        auVar66._0_4_ = auVar66._4_4_;
        auVar66._8_4_ = auVar66._12_4_;
        auVar75 = pshuflw(in_XMM12,auVar66,0xe8);
        auVar57._0_4_ = auVar57._4_4_;
        auVar57._8_4_ = auVar57._12_4_;
        auVar56 = pshuflw(auVar74,auVar57,0xe8);
        auVar56 = (auVar56 | auVar75 & auVar74) ^ auVar55;
        auVar56 = packssdw(auVar56,auVar56);
        sVar45 = (short)uVar21;
        if ((auVar56 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          *(short *)((long)local_168 + uVar21 * 2 + lVar35 * 2) = sVar45;
        }
        auVar57 = auVar66 & auVar64 | auVar57;
        auVar56 = packssdw(auVar57,auVar57);
        auVar56 = packssdw(auVar56 ^ auVar55,auVar56 ^ auVar55);
        if ((auVar56._0_4_ >> 0x10 & 1) != 0) {
          *(short *)((long)local_168 + uVar21 * 2 + lVar35 * 2 + 2) = sVar45 + 1;
        }
        auVar56 = auVar53 ^ auVar51;
        iVar69 = -(uint)(iVar46 < auVar56._0_4_);
        auVar70._4_4_ = -(uint)(iVar12 < auVar56._4_4_);
        iVar72 = -(uint)(iVar73 < auVar56._8_4_);
        auVar70._12_4_ = -(uint)(iVar49 < auVar56._12_4_);
        auVar58._4_4_ = iVar69;
        auVar58._0_4_ = iVar69;
        auVar58._8_4_ = iVar72;
        auVar58._12_4_ = iVar72;
        auVar65._4_4_ = -(uint)(auVar56._4_4_ == iVar12);
        auVar65._12_4_ = -(uint)(auVar56._12_4_ == iVar49);
        auVar65._0_4_ = auVar65._4_4_;
        auVar65._8_4_ = auVar65._12_4_;
        auVar70._0_4_ = auVar70._4_4_;
        auVar70._8_4_ = auVar70._12_4_;
        auVar56 = auVar65 & auVar58 | auVar70;
        auVar56 = packssdw(auVar56,auVar56);
        auVar56 = packssdw(auVar56 ^ auVar55,auVar56 ^ auVar55);
        if ((auVar56 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
          *(short *)((long)local_168 + uVar21 * 2 + lVar35 * 2 + 4) = sVar45 + 2;
        }
        auVar59 = pshufhw(auVar58,auVar58,0x84);
        auVar66 = pshufhw(auVar65,auVar65,0x84);
        auVar60 = pshufhw(auVar59,auVar70,0x84);
        auVar59 = (auVar60 | auVar66 & auVar59) ^ auVar55;
        auVar59 = packssdw(auVar59,auVar59);
        if ((auVar59 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
          *(short *)((long)local_168 + uVar21 * 2 + lVar35 * 2 + 6) = sVar45 + 3;
        }
        auVar59 = auVar52 ^ auVar51;
        iVar69 = -(uint)(iVar46 < auVar59._0_4_);
        auVar62._4_4_ = -(uint)(iVar12 < auVar59._4_4_);
        iVar72 = -(uint)(iVar73 < auVar59._8_4_);
        auVar62._12_4_ = -(uint)(iVar49 < auVar59._12_4_);
        auVar67._4_4_ = iVar69;
        auVar67._0_4_ = iVar69;
        auVar67._8_4_ = iVar72;
        auVar67._12_4_ = iVar72;
        auVar56 = pshuflw(auVar56,auVar67,0xe8);
        auVar61._4_4_ = -(uint)(auVar59._4_4_ == iVar12);
        auVar61._12_4_ = -(uint)(auVar59._12_4_ == iVar49);
        auVar61._0_4_ = auVar61._4_4_;
        auVar61._8_4_ = auVar61._12_4_;
        in_XMM12 = pshuflw(auVar75 & auVar74,auVar61,0xe8);
        in_XMM12 = in_XMM12 & auVar56;
        auVar62._0_4_ = auVar62._4_4_;
        auVar62._8_4_ = auVar62._12_4_;
        auVar56 = pshuflw(auVar56,auVar62,0xe8);
        auVar56 = (auVar56 | in_XMM12) ^ auVar55;
        auVar56 = packssdw(auVar56,auVar56);
        if ((auVar56 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          *(short *)((long)local_168 + uVar21 * 2 + lVar35 * 2 + 8) = sVar45 + 4;
        }
        auVar62 = auVar61 & auVar67 | auVar62;
        auVar56 = packssdw(auVar62,auVar62);
        auVar56 = packssdw(auVar56 ^ auVar55,auVar56 ^ auVar55);
        if ((auVar56 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
          *(short *)((long)local_168 + uVar21 * 2 + lVar35 * 2 + 10) = sVar45 + 5;
        }
        auVar56 = auVar50 ^ auVar51;
        iVar46 = -(uint)(iVar46 < auVar56._0_4_);
        auVar71._4_4_ = -(uint)(iVar12 < auVar56._4_4_);
        iVar73 = -(uint)(iVar73 < auVar56._8_4_);
        auVar71._12_4_ = -(uint)(iVar49 < auVar56._12_4_);
        auVar63._4_4_ = iVar46;
        auVar63._0_4_ = iVar46;
        auVar63._8_4_ = iVar73;
        auVar63._12_4_ = iVar73;
        auVar68._4_4_ = -(uint)(auVar56._4_4_ == iVar12);
        auVar68._12_4_ = -(uint)(auVar56._12_4_ == iVar49);
        auVar68._0_4_ = auVar68._4_4_;
        auVar68._8_4_ = auVar68._12_4_;
        auVar71._0_4_ = auVar71._4_4_;
        auVar71._8_4_ = auVar71._12_4_;
        auVar56 = auVar68 & auVar63 | auVar71;
        auVar56 = packssdw(auVar56,auVar56);
        in_XMM11 = packssdw(auVar56 ^ auVar55,auVar56 ^ auVar55);
        if ((in_XMM11 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
          *(short *)((long)local_168 + uVar21 * 2 + lVar35 * 2 + 0xc) = sVar45 + 6;
        }
        auVar56 = pshufhw(auVar63,auVar63,0x84);
        auVar75 = pshufhw(auVar68,auVar68,0x84);
        auVar74 = pshufhw(auVar56,auVar71,0x84);
        auVar56 = (auVar74 | auVar75 & auVar56) ^ auVar55;
        auVar56 = packssdw(auVar56,auVar56);
        if ((auVar56 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
          *(short *)((long)local_168 + uVar21 * 2 + lVar35 * 2 + 0xe) = sVar45 + 7;
        }
        uVar21 = uVar21 + 8;
        lVar43 = auVar54._8_8_;
        auVar54._0_8_ = auVar54._0_8_ + 8;
        auVar54._8_8_ = lVar43 + 8;
        lVar43 = auVar53._8_8_;
        auVar53._0_8_ = auVar53._0_8_ + 8;
        auVar53._8_8_ = lVar43 + 8;
        lVar43 = auVar52._8_8_;
        auVar52._0_8_ = auVar52._0_8_ + 8;
        auVar52._8_8_ = lVar43 + 8;
        lVar43 = auVar50._8_8_;
        auVar50._0_8_ = auVar50._0_8_ + 8;
        auVar50._8_8_ = lVar43 + 8;
      } while ((local_1a4 + 7 & 0xfffffff8) != uVar21);
    }
    local_1a0 = ppVVar47;
    if (0 < iVar23) {
      lVar43 = 0;
      do {
        pVVar42 = ppVVar17[lVar43];
        if (pVVar42 != (VP8LHistogram *)0x0) {
          uVar21 = (ulong)*(ushort *)((long)local_168 + lVar43 * 2);
          lVar36 = (long)*(short *)((long)&local_138[0].cur_pos + uVar21 * 4);
          if (lVar36 == -1) {
            *(short *)((long)&local_138[0].cur_pos + uVar21 * 4) = (short)lVar43;
          }
          else if ((int)local_190 == 0) {
            lVar38 = pVVar42->bit_cost_ * (long)local_158;
            lVar37 = lVar38 + 0x32;
            if (lVar38 < 0) {
              lVar37 = lVar38 + -0x32;
            }
            lVar38 = SUB168(SEXT816(lVar37) * SEXT816(0x5c28f5c28f5c28f5),8) - lVar37;
            pVVar26 = ppVVar17[lVar36];
            lVar29 = pVVar42->bit_cost_ + pVVar26->bit_cost_;
            lVar24 = (lVar38 >> 6) - (lVar38 >> 0x3f);
            lVar39 = lVar24 + lVar29;
            lVar38 = lVar39;
            if (0x7fffffffffffffff - lVar24 < lVar29) {
              lVar38 = 0x7fffffffffffffff;
            }
            if (lVar37 < 100) {
              lVar39 = lVar38;
            }
            iVar23 = GetCombinedHistogramEntropy(pVVar26,pVVar42,lVar39,(uint64_t *)&local_188);
            pVVar5 = local_178;
            if (iVar23 != 0) {
              local_150 = pVVar26;
              VP8LHistogramAdd(pVVar26,pVVar42,local_178);
              uVar14 = local_150->trivial_symbol_;
              if (uVar14 != pVVar42->trivial_symbol_) {
                uVar14 = 0xffffffff;
              }
              pVVar5->trivial_symbol_ = uVar14;
              pVVar5->bit_cost_ = (uint64_t)local_188.queue;
              pVVar5->palette_code_bits_ = local_150->palette_code_bits_;
              if (((uVar14 == 0xffffffff) &&
                  ((ppVVar17[lVar43]->trivial_symbol_ != 0xffffffff ||
                   (ppVVar17[lVar36]->trivial_symbol_ != 0xffffffff)))) &&
                 (uVar22 = *(ushort *)((long)&local_138[0].cur_pos + uVar21 * 4 + 2), uVar22 < 0x20)
                 ) {
                *(ushort *)((long)&local_138[0].cur_pos + uVar21 * 4 + 2) = uVar22 + 1;
              }
              else {
                pVVar42 = ppVVar17[lVar36];
                ppVVar17[lVar36] = local_178;
                HistogramSetRemoveHistogram(image_histo,(int)lVar43,(int *)&local_1a4);
                *(short *)((long)pvVar19 + (ulong)histogram_symbols[lVar43] * 2 + lVar35 * 2) =
                     (short)histogram_symbols[lVar36];
                local_178 = pVVar42;
              }
            }
          }
          else {
            pVVar26 = ppVVar17[lVar36];
            VP8LHistogramAdd(pVVar42,pVVar26,pVVar26);
            uVar14 = pVVar42->trivial_symbol_;
            if (uVar14 != pVVar26->trivial_symbol_) {
              uVar14 = 0xffffffff;
            }
            pVVar26->trivial_symbol_ = uVar14;
            HistogramSetRemoveHistogram(image_histo,(int)lVar43,(int *)&local_1a4);
            *(short *)((long)pvVar19 + (ulong)histogram_symbols[lVar43] * 2 + lVar35 * 2) =
                 (short)histogram_symbols[lVar36];
          }
        }
        lVar43 = lVar43 + 1;
      } while (lVar43 < image_histo->size);
    }
    __s = local_168;
    ppVVar47 = local_1a0;
    if (((int)local_190 != 0) && (0 < image_histo->size)) {
      lVar43 = 0;
      do {
        if (ppVVar17[lVar43] != (VP8LHistogram *)0x0) {
          UpdateHistogramCost(ppVVar17[lVar43]);
        }
        lVar43 = lVar43 + 1;
      } while (lVar43 < image_histo->size);
    }
    if (ppVVar47 != (VP8LHistogram **)0x0) {
      ppVVar17 = (VP8LHistogram **)0x0;
      bVar6 = false;
      do {
        do {
          bVar8 = bVar6;
          uVar22 = *(ushort *)((long)pvVar19 + (long)ppVVar17 * 2 + lVar35 * 2);
          uVar1 = *(ushort *)((long)pvVar19 + (ulong)uVar22 * 2 + lVar35 * 2);
          if (uVar22 != uVar1) {
            puVar32 = (ushort *)((long)pvVar19 + (ulong)uVar22 * 2 + lVar35 * 2);
            do {
              uVar22 = *(ushort *)((long)pvVar19 + (ulong)uVar1 * 2 + lVar35 * 2);
              *puVar32 = uVar22;
              puVar32 = (ushort *)((long)pvVar19 + (ulong)uVar22 * 2 + lVar35 * 2);
              uVar1 = *puVar32;
            } while (uVar22 != uVar1);
          }
          if (uVar22 != *(ushort *)((long)pvVar19 + (long)ppVVar17 * 2 + lVar35 * 2)) {
            *(ushort *)((long)pvVar19 + (long)ppVVar17 * 2 + lVar35 * 2) = uVar22;
            bVar8 = true;
          }
          ppVVar17 = (VP8LHistogram **)((long)ppVVar17 + 1);
          bVar6 = bVar8;
        } while (ppVVar17 != ppVVar47);
        if (ppVVar47 == (VP8LHistogram **)0x0) break;
        ppVVar17 = (VP8LHistogram **)0x0;
        bVar6 = false;
      } while (bVar8);
    }
    sVar45 = 0;
    memset(__s,0,(long)image_histo->max_size * 2);
    bVar33 = (byte)local_148;
    if (image_histo->max_size != 0) {
      uVar21 = 0;
      do {
        if ((ulong)histogram_symbols[uVar21] != 0xffffffff) {
          uVar25 = (ulong)*(ushort *)
                           ((long)pvVar19 + (ulong)histogram_symbols[uVar21] * 2 + lVar35 * 2);
          if ((uVar25 != 0) && (*(short *)((long)__s + uVar25 * 2) == 0)) {
            sVar45 = sVar45 + 1;
            *(short *)((long)__s + uVar25 * 2) = sVar45;
          }
          histogram_symbols[uVar21] = (uint)*(ushort *)((long)__s + uVar25 * 2);
        }
        uVar21 = uVar21 + 1;
      } while (uVar21 < (uint)image_histo->max_size);
    }
  }
  pVVar16 = local_160;
  uVar20 = local_1a4;
  if (((int)local_190 != 0 & bVar33) == 0) {
    iVar23 = local_194 * local_194 * local_194;
    lVar35 = (long)(iVar23 * 99);
    lVar43 = lVar35 + -500000;
    if (-1 < iVar23) {
      lVar43 = lVar35 + 500000;
    }
    uVar21 = SUB168(SEXT816(lVar43) * SEXT816(0x431bde82d7b634db),8);
    uVar25 = uVar21 >> 0x3f;
    iVar23 = (int)(uVar21 >> 0x12);
    iVar46 = SUB164(SEXT816(lVar43) * SEXT816(0x431bde82d7b634db),0xc) >> 0x1f;
    iVar12 = iVar23 - iVar46;
    nmemb = (uint64_t)(int)local_1a4;
    local_150 = (VP8LHistogram *)CONCAT44(local_150._4_4_,iVar12);
    if (iVar12 < (int)local_1a4) {
      ppVVar47 = image_histo->histograms;
      local_1a0 = (VP8LHistogram **)WebPSafeMalloc(nmemb,4);
      if (local_1a0 == (VP8LHistogram **)0x0) {
        cVar11 = '\x01';
      }
      else {
        local_188.size = 0;
        local_188.max_size = 9;
        local_188.queue = (HistogramPair *)WebPSafeMalloc(10,0x18);
        local_13c = (undefined4)
                    CONCAT71((int7)((ulong)local_188.queue >> 8),
                             (VP8LHistogram *)local_188.queue == (VP8LHistogram *)0x0);
        if ((VP8LHistogram *)local_188.queue != (VP8LHistogram *)0x0) {
          if (0 < image_histo->size) {
            lVar43 = 0;
            iVar12 = 0;
            do {
              if (ppVVar47[lVar43] != (VP8LHistogram *)0x0) {
                lVar35 = (long)iVar12;
                iVar12 = iVar12 + 1;
                *(int *)((long)local_1a0 + lVar35 * 4) = (int)lVar43;
              }
              lVar43 = lVar43 + 1;
            } while (lVar43 < image_histo->size);
          }
          local_140 = (iVar23 - iVar46) + 1;
          if (0 < (int)uVar20) {
            local_158 = (VP8LBackwardRefs *)CONCAT44(local_158._4_4_,(int)uVar20 / 2);
            uVar21 = 1;
            uVar15 = 0;
            uVar20 = 0;
            local_148 = nmemb;
            do {
              uVar2 = local_1a4;
              __nmemb = (size_t)(int)local_1a4;
              if ((int)local_1a4 <= (int)local_150) break;
              uVar20 = uVar20 + 1;
              if ((int)local_158 <= (int)uVar20) break;
              if (local_188.size == 0) {
                iVar40 = 0;
              }
              else {
                iVar40 = (local_188.queue)->cost_diff;
              }
              local_16c = 1;
              local_194 = uVar20;
              local_178 = (VP8LHistogram *)(ulong)uVar15;
              if (1 < (int)local_1a4) {
                uVar20 = (local_1a4 - 1) * local_1a4;
                iVar46 = (int)local_1a4 / 2;
                local_190 = (VP8LHistogram *)CONCAT44(local_190._4_4_,local_1a4 - 1);
                iVar23 = 1;
                do {
                  uVar15 = (uint)((uVar21 * 0xbc8f) / 0x7fffffff);
                  uVar21 = (ulong)((int)(uVar21 * 0xbc8f) + (uVar15 << 0x1f | uVar15));
                  uVar28 = uVar21 % (ulong)uVar20;
                  uVar25 = uVar28 / ((ulong)local_190 & 0xffffffff);
                  uVar15 = (uint)(uVar28 % ((ulong)local_190 & 0xffffffff));
                  iVar18 = HistoQueuePush(&local_188,ppVVar47,*(int *)((long)local_1a0 + uVar25 * 4)
                                          ,*(int *)((long)local_1a0 +
                                                   (ulong)((uVar15 + 1) -
                                                          (uint)(uVar15 < (uint)uVar25)) * 4),iVar40
                                         );
                  if (iVar18 < 0) {
                    if (local_188.size == local_188.max_size) break;
                  }
                  if (iVar18 < 0) {
                    iVar40 = iVar18;
                  }
                  if (((int)uVar2 < 2) || (bVar6 = iVar46 <= iVar23, iVar23 = iVar23 + 1, bVar6))
                  break;
                } while( true );
              }
              pHVar9 = local_188.queue;
              ppVVar17 = local_1a0;
              iVar23 = local_188.size;
              pVVar42 = (VP8LHistogram *)(local_188._8_8_ & 0xffffffff);
              iVar46 = (int)local_178;
              uVar20 = local_194;
              if (local_188.size != 0) {
                uVar20 = (local_188.queue)->idx1;
                local_16c = *(uint *)((long)&(local_188.queue)->idx1 + 4);
                pvVar19 = bsearch(&local_16c,local_1a0,__nmemb,4,PairComparison);
                memmove(pvVar19,(void *)((long)pvVar19 + 4),
                        (((ulong)~((long)pvVar19 - (long)ppVVar17) >> 2) + __nmemb) * 4);
                local_190 = ppVVar47[(int)local_16c];
                pVVar26 = ppVVar47[(int)uVar20];
                VP8LHistogramAdd(local_190,pVVar26,pVVar26);
                uVar14 = local_190->trivial_symbol_;
                if (uVar14 != pVVar26->trivial_symbol_) {
                  uVar14 = 0xffffffff;
                }
                pVVar26->trivial_symbol_ = uVar14;
                ppVVar47[(int)uVar20]->bit_cost_ = *(uint64_t *)((long)&pHVar9->cost_diff + 8);
                HistogramSetRemoveHistogram(image_histo,local_16c,(int *)&local_1a4);
                if (0 < iVar23) {
                  iVar23 = 0;
                  do {
                    pair = (HistogramPair *)((long)&pHVar9->cost_diff + ((long)iVar23 * 6 + -2) * 4)
                    ;
                    uVar15 = pair->idx1;
                    uVar2 = pair->idx2;
                    if ((uVar15 != local_16c && uVar15 != uVar20) ||
                       (uVar2 != local_16c && uVar2 != uVar20)) {
                      if (uVar15 != local_16c && uVar15 != uVar20) {
                        bVar6 = true;
                        if (uVar2 == local_16c || uVar2 == uVar20) {
                          pair->idx2 = uVar20;
                          goto LAB_00148a9b;
                        }
                      }
                      else {
                        pair->idx1 = uVar20;
LAB_00148a9b:
                        bVar6 = false;
                      }
                      iVar46 = pair->idx2;
                      if (iVar46 < pair->idx1) {
                        pair->idx2 = pair->idx1;
                        pair->idx1 = iVar46;
                      }
                      if ((!bVar6) &&
                         (local_190 = pVVar42,
                         iVar46 = HistoQueueUpdatePair
                                            (ppVVar47[pair->idx1],ppVVar47[pair->idx2],0,pair),
                         pVVar42 = local_190, iVar46 == 0)) {
                        pVVar42 = (VP8LHistogram *)(long)(int)local_190;
                        pVVar26 = pVVar42;
                        goto LAB_00148a6d;
                      }
                      if (pair->cost_diff < pHVar9->cost_diff) {
                        local_138[0].last_pos_ = *(PixOrCopy **)((long)&pHVar9->cost_diff + 8);
                        local_138[0].cur_pos = *(PixOrCopy **)&pHVar9->idx1;
                        local_138[0].cur_block_ = (PixOrCopyBlock *)pHVar9->cost_diff;
                        *(uint64_t *)((long)&pHVar9->cost_diff + 8) = pair->cost_combo;
                        iVar40 = pair->cost_diff;
                        *(uint32_t **)&pHVar9->idx1 = *(uint32_t **)pair;
                        pHVar9->cost_diff = iVar40;
                        pair->cost_combo = (uint64_t)local_138[0].last_pos_;
                        *(PixOrCopy **)pair = local_138[0].cur_pos;
                        pair->cost_diff = (int64_t)local_138[0].cur_block_;
                      }
                      iVar23 = iVar23 + 1;
                    }
                    else {
                      pVVar26 = (VP8LHistogram *)(long)(int)pVVar42;
LAB_00148a6d:
                      pair->cost_combo =
                           *(uint64_t *)((long)&pHVar9->cost_diff + ((long)pVVar26 * 6 + -4) * 4);
                      puVar30 = (uint32_t *)
                                ((long)&pHVar9->cost_diff + ((long)pVVar26 * 6 + -8) * 4);
                      uVar14 = puVar30[1];
                      iVar40 = *(int64_t *)(puVar30 + 2);
                      pair->idx1 = puVar30[0];
                      pair->idx2 = uVar14;
                      pair->cost_diff = iVar40;
                      pVVar42 = (VP8LHistogram *)(ulong)((int)pVVar42 - 1);
                    }
                  } while (iVar23 < (int)pVVar42);
                }
                local_188.size = (int)pVVar42;
                uVar20 = 0;
                iVar46 = (int)local_178;
              }
              uVar15 = iVar46 + 1;
            } while (uVar15 != (uint)local_148);
          }
          uVar25 = (ulong)(local_140 < (int)local_1a4);
          pVVar16 = local_160;
        }
        WebPSafeFree(local_188.queue);
        local_188.size = 0;
        local_188.max_size = 0;
        WebPSafeFree(local_1a0);
        cVar11 = (char)local_13c;
      }
    }
    else {
      uVar25 = 0;
      cVar11 = '\0';
    }
    pvVar19 = local_168;
    if (cVar11 == '\0') {
      if (uVar25 != 0) goto LAB_0014870e;
      iVar23 = image_histo->size;
      if ((long)iVar23 < 1) {
        uVar20 = 0;
      }
      else {
        lVar43 = 0;
        uVar20 = 0;
        do {
          pVVar42 = image_histo->histograms[lVar43];
          if (pVVar42 != (VP8LHistogram *)0x0) {
            uVar21 = (ulong)uVar20;
            uVar20 = uVar20 + 1;
            image_histo->histograms[uVar21] = pVVar42;
          }
          lVar43 = lVar43 + 1;
        } while (iVar23 != lVar43);
      }
      image_histo->size = uVar20;
      ppVVar47 = image_histo->histograms;
      local_188._8_8_ = (ulong)(uVar20 * uVar20) << 0x20;
      local_188.queue = (HistogramPair *)WebPSafeMalloc((ulong)(uVar20 * uVar20 + 1),0x18);
      if ((VP8LHistogram *)local_188.queue == (VP8LHistogram *)0x0) {
        WebPSafeFree((void *)0x0);
      }
      else {
        local_190 = (VP8LHistogram *)local_188.queue;
        if (0 < (int)uVar20) {
          uVar28 = (ulong)uVar20;
          uVar25 = 1;
          uVar21 = 0;
          do {
            uVar31 = uVar21 + 1;
            uVar41 = uVar25;
            if (uVar31 < uVar28 && image_histo->histograms[uVar21] != (VP8LHistogram *)0x0) {
              do {
                if (image_histo->histograms[uVar41] != (VP8LHistogram *)0x0) {
                  HistoQueuePush(&local_188,ppVVar47,(int)uVar21,(int)uVar41,0);
                }
                uVar41 = uVar41 + 1;
              } while (uVar28 != uVar41);
            }
            uVar25 = uVar25 + 1;
            uVar21 = uVar31;
          } while (uVar31 != uVar28);
        }
        while (pHVar9 = local_188.queue, 0 < local_188.size) {
          uVar20 = (local_188.queue)->idx1;
          local_1a0 = (VP8LHistogram **)(long)(int)uVar20;
          uVar15 = *(uint *)((long)&(local_188.queue)->idx1 + 4);
          pVVar42 = ppVVar47[(int)uVar15];
          pVVar26 = ppVVar47[(long)local_1a0];
          VP8LHistogramAdd(pVVar42,pVVar26,pVVar26);
          uVar14 = pVVar42->trivial_symbol_;
          if (uVar14 != pVVar26->trivial_symbol_) {
            uVar14 = 0xffffffff;
          }
          pVVar26->trivial_symbol_ = uVar14;
          ppVVar47[(long)local_1a0]->bit_cost_ = *(uint64_t *)((long)&pHVar9->cost_diff + 8);
          HistogramSetRemoveHistogram(image_histo,uVar15,(int *)&local_1a4);
          iVar23 = local_188.size;
          if (0 < local_188.size) {
            iVar46 = 0;
            do {
              puVar30 = (uint32_t *)((long)&pHVar9->cost_diff + ((long)iVar46 * 6 + -2) * 4);
              if ((((*puVar30 == uVar20) || (puVar30[1] == uVar15)) || (*puVar30 == uVar15)) ||
                 (puVar30[1] == uVar20)) {
                *(undefined8 *)(puVar30 + 4) =
                     *(undefined8 *)((long)&pHVar9->cost_diff + ((long)iVar23 * 6 + -4) * 4);
                uVar7 = *(undefined8 *)
                         ((uint32_t *)((long)&pHVar9->cost_diff + ((long)iVar23 * 6 + -8) * 4) + 2);
                *(undefined8 *)puVar30 =
                     *(undefined8 *)((long)&pHVar9->cost_diff + ((long)iVar23 * 6 + -8) * 4);
                *(undefined8 *)(puVar30 + 2) = uVar7;
                iVar23 = iVar23 + -1;
              }
              else {
                if (*(long *)(puVar30 + 2) < pHVar9->cost_diff) {
                  local_138[0].last_pos_ = *(PixOrCopy **)((long)&pHVar9->cost_diff + 8);
                  local_138[0].cur_pos = *(PixOrCopy **)&pHVar9->idx1;
                  local_138[0].cur_block_ = (PixOrCopyBlock *)pHVar9->cost_diff;
                  *(undefined8 *)((long)&pHVar9->cost_diff + 8) = *(undefined8 *)(puVar30 + 4);
                  uVar7 = *(undefined8 *)(puVar30 + 2);
                  *(uint32_t **)&pHVar9->idx1 = *(uint32_t **)puVar30;
                  pHVar9->cost_diff = uVar7;
                  *(PixOrCopy **)(puVar30 + 4) = local_138[0].last_pos_;
                  *(PixOrCopy **)puVar30 = local_138[0].cur_pos;
                  *(PixOrCopyBlock **)(puVar30 + 2) = local_138[0].cur_block_;
                }
                iVar46 = iVar46 + 1;
              }
            } while (iVar46 < iVar23);
          }
          local_188.size = iVar23;
          if (0 < image_histo->size) {
            uVar21 = 0;
            do {
              if ((uVar20 != uVar21) && (image_histo->histograms[uVar21] != (VP8LHistogram *)0x0)) {
                HistoQueuePush(&local_188,image_histo->histograms,uVar20,(int)uVar21,0);
              }
              uVar21 = uVar21 + 1;
            } while ((long)uVar21 < (long)image_histo->size);
          }
        }
        WebPSafeFree(local_188.queue);
        pvVar19 = local_168;
        pVVar16 = local_160;
        if (local_190 != (VP8LHistogram *)0x0) goto LAB_0014870e;
      }
    }
    WebPEncodingSetError(pic,VP8_ENC_ERROR_OUT_OF_MEMORY);
  }
  else {
LAB_0014870e:
    iVar23 = image_histo->size;
    if ((long)iVar23 < 1) {
      local_194 = 0;
    }
    else {
      lVar43 = 0;
      uVar21 = 0;
      do {
        pVVar42 = image_histo->histograms[lVar43];
        uVar25 = uVar21;
        if (pVVar42 != (VP8LHistogram *)0x0) {
          uVar25 = (ulong)((int)uVar21 + 1);
          image_histo->histograms[uVar21] = pVVar42;
        }
        local_194 = (uint)uVar25;
        lVar43 = lVar43 + 1;
        uVar21 = uVar25;
      } while (iVar23 != lVar43);
    }
    image_histo->size = local_194;
    ppVVar47 = pVVar16->histograms;
    local_1a0 = image_histo->histograms;
    uVar20 = image_histo->max_size;
    pVVar42 = (VP8LHistogram *)(ulong)uVar20;
    if ((int)local_194 < 2) {
      if (0 < (int)uVar20) {
        memset(histogram_symbols,0,(long)pVVar42 * 4);
      }
    }
    else if (0 < (int)uVar20) {
      local_190 = (VP8LHistogram *)(ulong)local_194;
      pVVar26 = (VP8LHistogram *)0x0;
      local_178 = pVVar42;
      do {
        if (ppVVar47[(long)pVVar26] == (VP8LHistogram *)0x0) {
          histogram_symbols[(long)pVVar26] = histogram_symbols[(long)&pVVar26[-1].field_0xcd7];
        }
        else {
          pVVar42 = (VP8LHistogram *)0x0;
          lVar43 = 0x7fffffffffffffff;
          uVar21 = 0;
          do {
            pVVar5 = local_1a0[(long)pVVar42];
            lVar35 = pVVar5->bit_cost_ + lVar43;
            lVar36 = lVar35;
            if (0x7fffffffffffffff - lVar43 < (long)pVVar5->bit_cost_) {
              lVar36 = 0x7fffffffffffffff;
            }
            if (lVar43 < 0) {
              lVar36 = lVar35;
            }
            iVar23 = GetCombinedHistogramEntropy
                               (pVVar5,ppVVar47[(long)pVVar26],lVar36,(uint64_t *)local_138);
            if (iVar23 != 0) {
              lVar43 = (long)local_138[0].cur_pos - pVVar5->bit_cost_;
              uVar21 = (ulong)pVVar42 & 0xffffffff;
            }
            pVVar42 = (VP8LHistogram *)((long)&pVVar42->literal_ + 1);
          } while (local_190 != pVVar42);
          histogram_symbols[(long)pVVar26] = (uint32_t)uVar21;
          pVVar42 = local_178;
        }
        pVVar26 = (VP8LHistogram *)((long)&pVVar26->literal_ + 1);
      } while (pVVar26 != pVVar42);
    }
    VP8LHistogramSetClear(image_histo);
    image_histo->size = local_194;
    if (0 < (int)pVVar42) {
      pVVar26 = (VP8LHistogram *)0x0;
      do {
        pVVar5 = ppVVar47[(long)pVVar26];
        if (pVVar5 != (VP8LHistogram *)0x0) {
          b = local_1a0[(int)histogram_symbols[(long)pVVar26]];
          VP8LHistogramAdd(pVVar5,b,b);
          uVar14 = pVVar5->trivial_symbol_;
          if (uVar14 != b->trivial_symbol_) {
            uVar14 = 0xffffffff;
          }
          b->trivial_symbol_ = uVar14;
        }
        pVVar26 = (VP8LHistogram *)((long)&pVVar26->literal_ + 1);
      } while (pVVar42 != pVVar26);
    }
    WebPReportProgress(pic,percent_range + *percent,percent);
    pvVar19 = local_168;
    pVVar16 = local_160;
  }
LAB_00148d56:
  WebPSafeFree(pVVar16);
  WebPSafeFree(pvVar19);
  return (int)(pic->error_code == VP8_ENC_OK);
}

Assistant:

int VP8LGetHistoImageSymbols(int xsize, int ysize,
                             const VP8LBackwardRefs* const refs, int quality,
                             int low_effort, int histogram_bits, int cache_bits,
                             VP8LHistogramSet* const image_histo,
                             VP8LHistogram* const tmp_histo,
                             uint32_t* const histogram_symbols,
                             const WebPPicture* const pic, int percent_range,
                             int* const percent) {
  const int histo_xsize =
      histogram_bits ? VP8LSubSampleSize(xsize, histogram_bits) : 1;
  const int histo_ysize =
      histogram_bits ? VP8LSubSampleSize(ysize, histogram_bits) : 1;
  const int image_histo_raw_size = histo_xsize * histo_ysize;
  VP8LHistogramSet* const orig_histo =
      VP8LAllocateHistogramSet(image_histo_raw_size, cache_bits);
  // Don't attempt linear bin-partition heuristic for
  // histograms of small sizes (as bin_map will be very sparse) and
  // maximum quality q==100 (to preserve the compression gains at that level).
  const int entropy_combine_num_bins = low_effort ? NUM_PARTITIONS : BIN_SIZE;
  int entropy_combine;
  uint16_t* const map_tmp =
      (uint16_t*)WebPSafeMalloc(2 * image_histo_raw_size, sizeof(*map_tmp));
  uint16_t* const cluster_mappings = map_tmp + image_histo_raw_size;
  int num_used = image_histo_raw_size;
  if (orig_histo == NULL || map_tmp == NULL) {
    WebPEncodingSetError(pic, VP8_ENC_ERROR_OUT_OF_MEMORY);
    goto Error;
  }

  // Construct the histograms from backward references.
  HistogramBuild(xsize, histogram_bits, refs, orig_histo);
  // Copies the histograms and computes its bit_cost.
  // histogram_symbols is optimized
  HistogramCopyAndAnalyze(orig_histo, image_histo, &num_used,
                          histogram_symbols);

  entropy_combine =
      (num_used > entropy_combine_num_bins * 2) && (quality < 100);

  if (entropy_combine) {
    uint16_t* const bin_map = map_tmp;
    const int32_t combine_cost_factor =
        GetCombineCostFactor(image_histo_raw_size, quality);
    const uint32_t num_clusters = num_used;

    HistogramAnalyzeEntropyBin(image_histo, bin_map, low_effort);
    // Collapse histograms with similar entropy.
    HistogramCombineEntropyBin(
        image_histo, &num_used, histogram_symbols, cluster_mappings, tmp_histo,
        bin_map, entropy_combine_num_bins, combine_cost_factor, low_effort);
    OptimizeHistogramSymbols(image_histo, cluster_mappings, num_clusters,
                             map_tmp, histogram_symbols);
  }

  // Don't combine the histograms using stochastic and greedy heuristics for
  // low-effort compression mode.
  if (!low_effort || !entropy_combine) {
    // cubic ramp between 1 and MAX_HISTO_GREEDY:
    const int threshold_size =
        (int)(1 + DivRound(quality * quality * quality * (MAX_HISTO_GREEDY - 1),
                           100 * 100 * 100));
    int do_greedy;
    if (!HistogramCombineStochastic(image_histo, &num_used, threshold_size,
                                    &do_greedy)) {
      WebPEncodingSetError(pic, VP8_ENC_ERROR_OUT_OF_MEMORY);
      goto Error;
    }
    if (do_greedy) {
      RemoveEmptyHistograms(image_histo);
      if (!HistogramCombineGreedy(image_histo, &num_used)) {
        WebPEncodingSetError(pic, VP8_ENC_ERROR_OUT_OF_MEMORY);
        goto Error;
      }
    }
  }

  // Find the optimal map from original histograms to the final ones.
  RemoveEmptyHistograms(image_histo);
  HistogramRemap(orig_histo, image_histo, histogram_symbols);

  if (!WebPReportProgress(pic, *percent + percent_range, percent)) {
    goto Error;
  }

 Error:
  VP8LFreeHistogramSet(orig_histo);
  WebPSafeFree(map_tmp);
  return (pic->error_code == VP8_ENC_OK);
}